

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir-htab.h
# Opt level: O1

void mir_htab_error(char *message)

{
  fprintf(_stderr,"%s\n","htab: no memory");
  exit(1);
}

Assistant:

static inline void MIR_HTAB_NO_RETURN mir_htab_error (const char *message) {
#ifdef MIR_HTAB_ERROR
  MIR_HTAB_ERROR (message);
  assert (FALSE);
#else
  fprintf (stderr, "%s\n", message);
#endif
  exit (1);
}